

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O3

_Bool PPC_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  cs_detail *__s;
  long lVar1;
  uint8_t *puVar2;
  uint8_t *orig_p;
  byte bVar3;
  uint16_t uVar4;
  MCInst *MI;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t Address;
  uint uVar8;
  ulong uVar9;
  uint8_t *orig_p_2;
  uint8_t *puVar10;
  ulong uVar11;
  byte *pbVar12;
  uint8_t *orig_p_1;
  DecodeStatus S;
  _Bool _Var13;
  int local_3c;
  
  if (code_len < 4) {
    uVar4 = 0;
    _Var13 = false;
  }
  else {
    if (instr->csh->mode < CS_MODE_ARM) {
      uVar6 = *(uint *)code;
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    }
    else {
      uVar6 = *(uint *)code;
    }
    __s = instr->flat_insn->detail;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x5f8);
    }
    uVar7 = 0;
    local_3c = 3;
    Address = 0xffffffff;
    puVar2 = DecoderTable32;
LAB_00189f68:
    puVar10 = puVar2;
    switch(*puVar10) {
    case '\x01':
      uVar7 = ~(-1 << (puVar10[2] & 0x1f)) << (puVar10[1] & 0x1f);
      if (puVar10[2] == 0x20) {
        uVar7 = 0xffffffff;
      }
      uVar7 = (uVar7 & uVar6) >> (puVar10[1] & 0x1f);
      puVar2 = puVar10 + 3;
      goto LAB_00189f68;
    case '\x02':
      uVar9 = 0;
      address = 0;
      bVar3 = 0;
      do {
        lVar1 = uVar9 + 1;
        uVar5 = (int)address + ((puVar10[lVar1] & 0x7f) << (bVar3 & 0x1f));
        address = (uint64_t)uVar5;
        bVar3 = bVar3 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar10[lVar1] < '\0');
      puVar2 = puVar10 + (uVar9 & 0xffffffff) + 3;
      if (uVar7 != uVar5) {
        puVar2 = puVar10 + (uVar9 & 0xffffffff) + 3 +
                 *(ushort *)(puVar10 + (uVar9 & 0xffffffff) + 1);
      }
      goto LAB_00189f68;
    case '\x03':
      uVar5 = ~(-1 << (puVar10[2] & 0x1f)) << (puVar10[1] & 0x1f);
      uVar9 = 0;
      address = 0;
      bVar3 = 0;
      do {
        lVar1 = uVar9 + 3;
        uVar8 = (int)address + ((puVar10[lVar1] & 0x7f) << (bVar3 & 0x1f));
        address = (uint64_t)uVar8;
        bVar3 = bVar3 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar10[lVar1] < '\0');
      if (puVar10[2] == 0x20) {
        uVar5 = 0xffffffff;
      }
      puVar2 = puVar10 + (uVar9 & 0xffffffff) + 5;
      if ((uVar5 & uVar6) >> (puVar10[1] & 0x1f) != uVar8) {
        puVar2 = puVar10 + (uVar9 & 0xffffffff) + 5 +
                 *(ushort *)(puVar10 + (uVar9 & 0xffffffff) + 3);
      }
      goto LAB_00189f68;
    case '\x04':
      uVar9 = 0;
      do {
        lVar1 = uVar9 + 1;
        uVar9 = uVar9 + 1;
      } while ((char)puVar10[lVar1] < '\0');
      puVar2 = puVar10 + (uVar9 & 0xffffffff) + 3;
      goto LAB_00189f68;
    case '\x05':
      uVar9 = 0;
      uVar7 = 0;
      bVar3 = 0;
      do {
        lVar1 = uVar9 + 1;
        uVar7 = uVar7 + ((puVar10[lVar1] & 0x7f) << (bVar3 & 0x1f));
        bVar3 = bVar3 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar10[lVar1] < '\0');
      pbVar12 = puVar10 + (uVar9 & 0xffffffff) + 1;
      S = MCDisassembler_Fail;
      MI = (MCInst *)0x0;
      do {
        bVar3 = *pbVar12;
        S = S + ((bVar3 & 0x7f) << ((byte)MI & 0x1f));
        MI = (MCInst *)(ulong)((int)MI + 7);
        pbVar12 = pbVar12 + 1;
      } while ((char)bVar3 < '\0');
      MCInst_setOpcode(instr,uVar7);
      decodeToMCInst_4(S,uVar6,(uint32_t)instr,MI,Address,(void *)address);
      _Var13 = local_3c == 3;
      uVar4 = 4;
      break;
    case '\x06':
      uVar9 = 0;
      uVar5 = 0;
      bVar3 = 0;
      do {
        lVar1 = uVar9 + 1;
        uVar5 = uVar5 + ((puVar10[lVar1] & 0x7f) << (bVar3 & 0x1f));
        bVar3 = bVar3 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar10[lVar1] < '\0');
      uVar11 = 0;
      uVar8 = 0;
      bVar3 = 0;
      do {
        lVar1 = uVar11 + (uVar9 & 0xffffffff) + 1;
        uVar8 = uVar8 + ((puVar10[lVar1] & 0x7f) << (bVar3 & 0x1f));
        bVar3 = bVar3 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar10[lVar1] < '\0');
      uVar5 = uVar8 & ~uVar6 | uVar5 & uVar6;
      address = (uint64_t)uVar5;
      puVar2 = puVar10 + (uVar11 & 0xffffffff) + (uVar9 & 0xffffffff) + 1;
      if (uVar5 != 0) {
        local_3c = 1;
      }
      goto LAB_00189f68;
    default:
      MCInst_clear(instr);
      uVar4 = 0;
      _Var13 = false;
    }
  }
  *size = uVar4;
  return _Var13;
}

Assistant:

static DecodeStatus getInstruction(MCInst *MI,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, MCRegisterInfo *MRI)
{
	uint32_t insn;
	DecodeStatus result;
	// Get the four bytes of the instruction.
	if (code_len < 4) {
		// not enough data
		*Size = 0;
		return MCDisassembler_Fail;
	}

	// The instruction is big-endian encoded.
	if (MI->csh->mode & CS_MODE_BIG_ENDIAN)
		insn = (code[0] << 24) | (code[1] << 16) |
			(code[2] <<  8) | (code[3] <<  0);
	else
		insn = (code[3] << 24) | (code[2] << 16) |
			(code[1] <<  8) | (code[0] <<  0);

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	result = decodeInstruction_4(DecoderTable32, MI, insn, Address, 4);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	// report error
	MCInst_clear(MI);
	*Size = 0;
	return MCDisassembler_Fail;
}